

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolList.hpp
# Opt level: O2

void __thiscall
PoolList<Server::Private::ListenerImpl>::clear(PoolList<Server::Private::ListenerImpl> *this)

{
  Item *pIVar1;
  Iterator *pIVar2;
  
  pIVar2 = &this->_begin;
  while (pIVar1 = pIVar2->item, pIVar1 != &this->endItem) {
    Socket::~Socket((Socket *)(pIVar1 + 1));
    pIVar1->prev = this->freeItem;
    this->freeItem = pIVar1;
    pIVar2 = (Iterator *)&pIVar1->next;
  }
  (this->_begin).item = &this->endItem;
  this->_size = 0;
  (this->endItem).prev = (Item *)0x0;
  return;
}

Assistant:

void clear()
  {
    for(Item* i = _begin.item, * end = &endItem; i != end; i = i->next)
    {
      ((T*)(i + 1))->~T();
      i->prev = freeItem;
      freeItem = i;
    }
    _begin.item = &endItem;
    endItem.prev = 0;
    _size = 0;
  }